

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O3

int archive_read_format_iso9660_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  uint uVar1;
  void *pvVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  size_t sVar6;
  void *pvVar7;
  ulong uVar8;
  ulong *puVar9;
  int64_t iVar10;
  long lVar11;
  long lVar12;
  char *fmt;
  ulong uVar13;
  size_t __size;
  size_t sVar14;
  size_t local_48;
  long *local_40;
  size_t *local_38;
  
  pvVar2 = a->format->data;
  if (*(long *)((long)pvVar2 + 0xe0) != 0) {
    __archive_read_consume(a,*(long *)((long)pvVar2 + 0xe0));
    *(undefined8 *)((long)pvVar2 + 0xe0) = 0;
  }
  if (*(long *)((long)pvVar2 + 0xd8) < 1) {
    if (*(long *)((long)pvVar2 + 0x1e0) != 0) {
      puVar9 = *(ulong **)(*(long *)((long)pvVar2 + 0x1e0) + 0x10);
      *(ulong **)((long)pvVar2 + 0x1e0) = puVar9;
      if (puVar9 != (ulong *)0x0) {
        uVar8 = *(ulong *)((long)pvVar2 + 0xa0);
        uVar13 = *puVar9;
        if (uVar13 < uVar8 || uVar13 - uVar8 == 0) {
          if (uVar13 < uVar8) {
            archive_set_error(&a->archive,-1,"Ignoring out-of-order file (%s) %jd < %jd",
                              *(undefined8 *)((long)pvVar2 + 0x10));
            *buff = (void *)0x0;
            *size = 0;
            *offset = *(int64_t *)((long)pvVar2 + 0xd0);
            iVar10 = 0xffffffec;
            goto LAB_001539f0;
          }
        }
        else {
          iVar10 = __archive_read_consume(a,uVar13 - uVar8);
          if (iVar10 < 0) goto LAB_001539f0;
          puVar9 = *(ulong **)((long)pvVar2 + 0x1e0);
          *(ulong *)((long)pvVar2 + 0xa0) = *puVar9;
        }
        *(ulong *)((long)pvVar2 + 0xd8) = puVar9[1];
        goto LAB_00153471;
      }
    }
    *buff = (void *)0x0;
    *size = 0;
    *offset = *(int64_t *)((long)pvVar2 + 0xd0);
    iVar10 = 1;
    goto LAB_001539f0;
  }
LAB_00153471:
  if (*(int *)((long)pvVar2 + 0xe8) == 0) {
    pvVar5 = __archive_read_ahead(a,1,(ssize_t *)&local_48);
    *buff = pvVar5;
    if (local_48 == 0) {
      archive_set_error(&a->archive,-1,"Truncated input file");
      pvVar5 = *buff;
    }
    if (pvVar5 == (void *)0x0) goto LAB_001539eb;
    sVar14 = *(size_t *)((long)pvVar2 + 0xd8);
    if ((long)local_48 < (long)*(size_t *)((long)pvVar2 + 0xd8)) {
      sVar14 = local_48;
    }
    *size = sVar14;
    lVar11 = *(long *)((long)pvVar2 + 0xd0);
    *offset = lVar11;
    *(size_t *)((long)pvVar2 + 0xd0) = lVar11 + sVar14;
    *(long *)((long)pvVar2 + 0xd8) = *(long *)((long)pvVar2 + 0xd8) - sVar14;
    *(size_t *)((long)pvVar2 + 0xe0) = sVar14;
    *(long *)((long)pvVar2 + 0xa0) = *(long *)((long)pvVar2 + 0xa0) + sVar14;
  }
  else {
    pvVar2 = a->format->data;
    local_38 = size;
    pvVar5 = __archive_read_ahead(a,1,(ssize_t *)&local_48);
    if ((long)local_48 < 1) {
      fmt = "Truncated zisofs file body";
LAB_001539dc:
      iVar4 = 0x54;
LAB_001539e4:
      archive_set_error(&a->archive,iVar4,fmt);
LAB_001539eb:
      iVar10 = 0xffffffe2;
      goto LAB_001539f0;
    }
    if ((long)*(ulong *)((long)pvVar2 + 0xd8) < (long)local_48) {
      local_48 = *(ulong *)((long)pvVar2 + 0xd8);
    }
    sVar14 = local_48;
    if (*(int *)((long)pvVar2 + 0xf8) == 0) {
      uVar13 = 1L << (*(byte *)((long)pvVar2 + 0xec) & 0x3f);
      uVar8 = ((*(long *)((long)pvVar2 + 0xf0) + uVar13) - 1 >>
              (*(byte *)((long)pvVar2 + 0xec) & 0x3f)) * 4 + 4;
      local_40 = offset;
      if (*(ulong *)((long)pvVar2 + 0x140) < uVar8) {
        if (*(void **)((long)pvVar2 + 0x138) != (void *)0x0) {
          free(*(void **)((long)pvVar2 + 0x138));
        }
        __size = (uVar8 & 0xfffffffffffffc00) + 0x400;
        pvVar7 = malloc(__size);
        *(void **)((long)pvVar2 + 0x138) = pvVar7;
        if (pvVar7 != (void *)0x0) {
          *(size_t *)((long)pvVar2 + 0x140) = __size;
          uVar13 = 1L << (*(byte *)((long)pvVar2 + 0xec) & 0x3f);
          goto LAB_001536f2;
        }
LAB_001538c0:
        fmt = "No memory for zisofs decompression";
        iVar4 = 0xc;
        goto LAB_001539e4;
      }
LAB_001536f2:
      offset = local_40;
      *(ulong *)((long)pvVar2 + 0x148) = uVar8;
      if (*(ulong *)((long)pvVar2 + 0x108) < uVar13) {
        if (*(void **)((long)pvVar2 + 0x100) != (void *)0x0) {
          free(*(void **)((long)pvVar2 + 0x100));
        }
        pvVar7 = malloc(uVar13);
        *(void **)((long)pvVar2 + 0x100) = pvVar7;
        if (pvVar7 == (void *)0x0) goto LAB_001538c0;
      }
      *(ulong *)((long)pvVar2 + 0x108) = uVar13;
      uVar8 = *(ulong *)((long)pvVar2 + 0x128);
      if (uVar8 < 0x10) {
        uVar13 = 0x10 - uVar8;
        if (sVar14 < 0x10 - uVar8) {
          uVar13 = sVar14;
        }
        memcpy((void *)((long)pvVar2 + uVar8 + 0x114),pvVar5,uVar13);
        uVar8 = *(long *)((long)pvVar2 + 0x128) + uVar13;
        *(ulong *)((long)pvVar2 + 0x128) = uVar8;
        sVar14 = sVar14 - uVar13;
        pvVar5 = (void *)((long)pvVar5 + uVar13);
      }
      if (*(int *)((long)pvVar2 + 0x130) == 0) {
        if (uVar8 == 0x10) {
          if ((((*(uint *)((long)pvVar2 + 0xec) != (uint)*(byte *)((long)pvVar2 + 0x121)) ||
               (*(char *)((long)pvVar2 + 0x120) != '\x04')) ||
              (*(ulong *)((long)pvVar2 + 0xf0) != (ulong)*(uint *)((long)pvVar2 + 0x11c))) ||
             (*(long *)((long)pvVar2 + 0x114) != 0x7d6dbc99653e437)) {
            fmt = "Illegal zisofs file body";
            goto LAB_001539dc;
          }
          *(undefined4 *)((long)pvVar2 + 0x130) = 1;
          goto LAB_0015378d;
        }
      }
      else {
LAB_0015378d:
        uVar8 = *(ulong *)((long)pvVar2 + 0x150);
        uVar13 = *(ulong *)((long)pvVar2 + 0x148) - uVar8;
        if (uVar8 <= *(ulong *)((long)pvVar2 + 0x148) && uVar13 != 0) {
          if (sVar14 < uVar13) {
            uVar13 = sVar14;
          }
          memcpy((void *)(uVar8 + *(long *)((long)pvVar2 + 0x138)),pvVar5,uVar13);
          lVar11 = *(long *)((long)pvVar2 + 0x150) + uVar13;
          *(long *)((long)pvVar2 + 0x150) = lVar11;
          sVar14 = sVar14 - uVar13;
          pvVar5 = (void *)(uVar13 + (long)pvVar5);
          if (lVar11 == *(long *)((long)pvVar2 + 0x148)) {
            *(undefined8 *)((long)pvVar2 + 0x158) = 0;
            *(undefined4 *)((long)pvVar2 + 0x160) = 0;
            *(undefined4 *)((long)pvVar2 + 0xf8) = 1;
            goto LAB_001534dc;
          }
        }
      }
      if (*(int *)((long)pvVar2 + 0xf8) != 0) goto LAB_001534dc;
      sVar6 = 0;
    }
    else {
LAB_001534dc:
      uVar3 = *(uint *)((long)pvVar2 + 0x160);
      if (uVar3 == 0) {
        lVar11 = *(long *)((long)pvVar2 + 0x158);
        if (lVar11 + 4U < *(ulong *)((long)pvVar2 + 0x148)) {
          uVar3 = *(uint *)(*(long *)((long)pvVar2 + 0x138) + lVar11);
          if ((local_48 - sVar14) + (ulong)*(uint *)((long)pvVar2 + 0x110) != (ulong)uVar3) {
            fmt = "Illegal zisofs block pointers(cannot seek)";
            goto LAB_001539dc;
          }
          uVar1 = *(uint *)(*(long *)((long)pvVar2 + 0x138) + 4 + lVar11);
          if (uVar3 <= uVar1) {
            *(uint *)((long)pvVar2 + 0x160) = uVar1 - uVar3;
            *(ulong *)((long)pvVar2 + 0x158) = lVar11 + 4U;
            if (*(int *)((long)pvVar2 + 0x1d8) == 0) {
              iVar4 = cm_zlib_inflateInit_((z_streamp)((long)pvVar2 + 0x168),"1.2.3",0x70);
            }
            else {
              iVar4 = cm_zlib_inflateReset((z_streamp)((long)pvVar2 + 0x168));
            }
            if (iVar4 != 0) {
              fmt = "Can\'t initialize zisofs decompression.";
              iVar4 = -1;
              goto LAB_001539e4;
            }
            *(undefined4 *)((long)pvVar2 + 0x1d8) = 1;
            *(undefined8 *)((long)pvVar2 + 0x178) = 0;
            *(undefined8 *)((long)pvVar2 + 400) = 0;
            uVar3 = *(uint *)((long)pvVar2 + 0x160);
            if (uVar3 == 0) {
              memset(*(void **)((long)pvVar2 + 0x100),0,*(size_t *)((long)pvVar2 + 0x108));
              sVar6 = *(size_t *)((long)pvVar2 + 0x108);
              goto LAB_00153964;
            }
            goto LAB_001534ea;
          }
        }
        fmt = "Illegal zisofs block pointers";
        goto LAB_001539dc;
      }
LAB_001534ea:
      *(void **)((long)pvVar2 + 0x168) = pvVar5;
      if (sVar14 <= uVar3) {
        uVar3 = (uint)sVar14;
      }
      *(uint *)((long)pvVar2 + 0x170) = uVar3;
      *(undefined8 *)((long)pvVar2 + 0x180) = *(undefined8 *)((long)pvVar2 + 0x100);
      *(undefined4 *)((long)pvVar2 + 0x188) = *(undefined4 *)((long)pvVar2 + 0x108);
      uVar3 = cm_zlib_inflate((z_streamp)((long)pvVar2 + 0x168),0);
      if (1 < uVar3) {
        archive_set_error(&a->archive,-1,"zisofs decompression failed (%d)",(ulong)uVar3);
        goto LAB_001539eb;
      }
      sVar6 = *(long *)((long)pvVar2 + 0x108) - (ulong)*(uint *)((long)pvVar2 + 0x188);
      lVar11 = *(long *)((long)pvVar2 + 0x168) - (long)pvVar5;
      sVar14 = sVar14 - lVar11;
      *(int *)((long)pvVar2 + 0x160) = *(int *)((long)pvVar2 + 0x160) - (int)lVar11;
    }
LAB_00153964:
    lVar12 = local_48 - sVar14;
    *buff = *(void **)((long)pvVar2 + 0x100);
    *local_38 = sVar6;
    lVar11 = *(long *)((long)pvVar2 + 0xd0);
    *offset = lVar11;
    *(size_t *)((long)pvVar2 + 0xd0) = lVar11 + sVar6;
    *(long *)((long)pvVar2 + 0xd8) = *(long *)((long)pvVar2 + 0xd8) - lVar12;
    *(long *)((long)pvVar2 + 0xa0) = *(long *)((long)pvVar2 + 0xa0) + lVar12;
    *(int *)((long)pvVar2 + 0x110) = *(int *)((long)pvVar2 + 0x110) + (int)lVar12;
    *(long *)((long)pvVar2 + 0xe0) = *(long *)((long)pvVar2 + 0xe0) + lVar12;
  }
  iVar10 = 0;
LAB_001539f0:
  return (int)iVar10;
}

Assistant:

static int
archive_read_format_iso9660_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	ssize_t bytes_read;
	struct iso9660 *iso9660;

	iso9660 = (struct iso9660 *)(a->format->data);

	if (iso9660->entry_bytes_unconsumed) {
		__archive_read_consume(a, iso9660->entry_bytes_unconsumed);
		iso9660->entry_bytes_unconsumed = 0;
	}

	if (iso9660->entry_bytes_remaining <= 0) {
		if (iso9660->entry_content != NULL)
			iso9660->entry_content = iso9660->entry_content->next;
		if (iso9660->entry_content == NULL) {
			*buff = NULL;
			*size = 0;
			*offset = iso9660->entry_sparse_offset;
			return (ARCHIVE_EOF);
		}
		/* Seek forward to the start of the entry. */
		if (iso9660->current_position < iso9660->entry_content->offset) {
			int64_t step;

			step = iso9660->entry_content->offset -
			    iso9660->current_position;
			step = __archive_read_consume(a, step);
			if (step < 0)
				return ((int)step);
			iso9660->current_position =
			    iso9660->entry_content->offset;
		}
		if (iso9660->entry_content->offset < iso9660->current_position) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Ignoring out-of-order file (%s) %jd < %jd",
			    iso9660->pathname.s,
			    (intmax_t)iso9660->entry_content->offset,
			    (intmax_t)iso9660->current_position);
			*buff = NULL;
			*size = 0;
			*offset = iso9660->entry_sparse_offset;
			return (ARCHIVE_WARN);
		}
		iso9660->entry_bytes_remaining = iso9660->entry_content->size;
	}
	if (iso9660->entry_zisofs.pz)
		return (zisofs_read_data(a, buff, size, offset));

	*buff = __archive_read_ahead(a, 1, &bytes_read);
	if (bytes_read == 0)
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Truncated input file");
	if (*buff == NULL)
		return (ARCHIVE_FATAL);
	if (bytes_read > iso9660->entry_bytes_remaining)
		bytes_read = (ssize_t)iso9660->entry_bytes_remaining;
	*size = bytes_read;
	*offset = iso9660->entry_sparse_offset;
	iso9660->entry_sparse_offset += bytes_read;
	iso9660->entry_bytes_remaining -= bytes_read;
	iso9660->entry_bytes_unconsumed = bytes_read;
	iso9660->current_position += bytes_read;
	return (ARCHIVE_OK);
}